

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O2

NULLCArray NULLCPugiXML::description(xml_parse_result *desc)

{
  size_t sVar1;
  NULLCArray NVar2;
  xml_parse_result res;
  xml_parse_result local_28;
  
  pugi::xml_parse_result::xml_parse_result(&local_28);
  local_28.status = desc->status;
  local_28.offset = (ptrdiff_t)desc->offset;
  local_28.encoding = desc->encoding;
  NVar2.ptr = pugi::xml_parse_result::description(&local_28);
  sVar1 = strlen(NVar2.ptr);
  NVar2.len = (int)sVar1 + 1;
  return NVar2;
}

Assistant:

NULLCArray description(xml_parse_result* desc)
	{
		NULLCArray ret;
		pugi::xml_parse_result res;
		res.status = (pugi::xml_parse_status)desc->status;
		res.offset = desc->offset;
		res.encoding = (pugi::xml_encoding)desc->encoding;
		ret.ptr = (char*)res.description();
		ret.len = (unsigned)strlen(ret.ptr) + 1;
		return ret;
	}